

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

double __thiscall lda::lgamma(lda *this,double param_1)

{
  lda_math_mode lVar1;
  float fVar2;
  ostream *poVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined4 uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  lanczos13m53 local_2a;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_29;
  undefined4 local_28;
  uint uStack_24;
  uint uStack_1c;
  undefined1 local_18 [16];
  
  lVar1 = this->mmode;
  fVar5 = SUB84(param_1,0);
  if (lVar1 != USE_SIMD) {
    if (lVar1 == USE_PRECISE) {
      dVar6 = boost::math::detail::
              lgamma_imp<double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos13m53>
                        ((double)fVar5,&local_29,&local_2a,(int *)0x0);
      uVar8 = SUB84(dVar6,0);
      uVar9 = (uint)((ulong)dVar6 >> 0x20);
      uStack_24 = uVar9 & 0x7fffffff;
      uStack_1c = extraout_XMM0_Dd & 0x7fffffff;
      dVar7 = 0.0;
      local_28 = uVar8;
      if (3.4028234663852886e+38 <= ABS(dVar6) && ABS(dVar6) != 3.4028234663852886e+38) {
        local_18._8_4_ = extraout_XMM0_Dc;
        local_18._0_8_ = dVar6;
        local_18._12_4_ = extraout_XMM0_Dd;
        boost::math::policies::detail::raise_error<std::overflow_error,float>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        uVar8 = local_18._0_4_;
        uVar9 = local_18._4_4_;
        dVar7 = (double)(ulong)(uint)(float)local_18._0_8_;
      }
      if (3.4028234663852886e+38 <= (double)CONCAT44(uStack_24,local_28) &&
          (double)CONCAT44(uStack_24,local_28) != 3.4028234663852886e+38) {
        return dVar7;
      }
      return (double)(ulong)(uint)(float)(double)CONCAT44(uVar9,uVar8);
    }
    if (lVar1 != USE_FAST_APPROX) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "lda::lgamma: Trampled or invalid math mode, aborting");
      std::endl<char,std::char_traits<char>>(poVar3);
      abort();
    }
  }
  fVar10 = (fVar5 + 2.0) * (fVar5 + 1.0) * fVar5;
  fVar4 = (float)((uint)fVar10 & 0x7fffff | 0x3f000000);
  fVar11 = fVar5 + 3.0;
  fVar2 = (float)((uint)fVar11 & 0x7fffff | 0x3f000000);
  return (double)(ulong)(uint)(((fVar2 * -1.4980303 +
                                (float)(uint)fVar11 * 1.1920929e-07 + -124.22545) -
                               1.72588 / (fVar2 + 0.35208872)) * 0.6931472 * (fVar5 + 2.5) +
                              ((0.0833333 / fVar11 + (-2.0810614 - fVar5)) -
                              ((fVar4 * -1.4980303 +
                               (float)(uint)fVar10 * 1.1920929e-07 + -124.22545) -
                              1.72588 / (fVar4 + 0.35208872)) * 0.6931472));
}

Assistant:

float lda::lgamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::lgamma FAST_APPROX ";
      return ldamath::lgamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::lgamma PRECISE ";
      return ldamath::lgamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::gamma SIMD ";
      return ldamath::lgamma<float, USE_SIMD>(x);
    default:
      std::cerr << "lda::lgamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}